

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O0

void __thiscall
t_perl_generator::generate_service_helpers(t_perl_generator *this,t_service *tservice)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  ostream *poVar4;
  reference pptVar5;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string name;
  t_struct *ts;
  t_function **local_50;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_38;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_service *tservice_local;
  t_perl_generator *this_local;
  
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_38);
  poVar4 = std::operator<<((ostream *)&this->f_service_,"# HELPER FUNCTIONS AND STRUCTURES");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  local_50 = (t_function **)
             std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                       ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_38._M_current = local_50;
  while( true ) {
    ts = (t_struct *)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar2 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)&ts);
    if (!bVar2) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    name.field_2._8_8_ = t_function::get_arglist(*pptVar5);
    iVar3 = (*(((t_struct *)name.field_2._8_8_)->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::string((string *)local_80,(string *)CONCAT44(extraout_var,iVar3));
    uVar1 = name.field_2._8_8_;
    std::operator+(&local_c0,&(this->super_t_oop_generator).super_t_generator.service_name_,"_");
    std::operator+(&local_a0,&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    (**(code **)(*(long *)uVar1 + 0x10))(uVar1,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    generate_perl_struct_definition
              (this,(ostream *)&this->f_service_,(t_struct *)name.field_2._8_8_,false);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_38);
    generate_perl_function_helpers(this,*pptVar5);
    (**(code **)(*(long *)name.field_2._8_8_ + 0x10))(name.field_2._8_8_,local_80);
    std::__cxx11::string::~string((string *)local_80);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_38);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  return;
}

Assistant:

void t_perl_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  f_service_ << "# HELPER FUNCTIONS AND STRUCTURES" << endl << endl;

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    string name = ts->get_name();
    ts->set_name(service_name_ + "_" + name);
    generate_perl_struct_definition(f_service_, ts, false);
    generate_perl_function_helpers(*f_iter);
    ts->set_name(name);
  }
}